

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_cconvert.c
# Opt level: O3

int sp_cconvert(int m,int n,singlecomplex *A,int lda,int kl,int ku,singlecomplex *a,int_t *asub,
               int_t *xa,int_t *nnz)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if (n < 1) {
    uVar8 = (ulong)n;
    iVar2 = 0;
  }
  else {
    uVar3 = -ku;
    uVar8 = (ulong)(uint)n;
    uVar7 = 0;
    iVar2 = 0;
    do {
      xa[uVar7] = iVar2;
      iVar4 = (int)uVar7 - ku;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      uVar5 = (uint)((long)kl + uVar7);
      if ((long)uVar8 <= (long)((long)kl + uVar7)) {
        uVar5 = n - 1;
      }
      if (iVar4 <= (int)uVar5) {
        lVar1 = (long)iVar2;
        uVar6 = 0;
        if (0 < (int)uVar3) {
          uVar6 = (ulong)uVar3;
        }
        do {
          a[lVar1] = A[uVar6];
          asub[lVar1] = (int_t)uVar6;
          lVar1 = lVar1 + 1;
          bVar9 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar9);
      }
      iVar2 = (iVar2 - iVar4) + uVar5 + 1;
      uVar7 = uVar7 + 1;
      uVar3 = uVar3 + 1;
      A = A + lda;
    } while (uVar7 != uVar8);
  }
  *nnz = iVar2;
  xa[uVar8] = iVar2;
  return 0;
}

Assistant:

int
sp_cconvert(int m, int n, singlecomplex *A, int lda, int kl, int ku,
	   singlecomplex *a, int_t *asub, int_t *xa, int_t *nnz)
{
    int_t     lasta = 0;
    int_t     i, j, ilow, ihigh;
    int_t     *row;
    singlecomplex  *val;

    for (j = 0; j < n; ++j) {
	xa[j] = lasta;
	val = &a[xa[j]];
	row = &asub[xa[j]];

	ilow = SUPERLU_MAX(0, j - ku);
	ihigh = SUPERLU_MIN(n-1, j + kl);
	for (i = ilow; i <= ihigh; ++i) {
	    val[i-ilow] = A[i + j*lda];
	    row[i-ilow] = i;
	}
	lasta += ihigh - ilow + 1;
    }

    xa[n] = *nnz = lasta;
    return 0;
}